

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

BCReg cur_topslot(GCproto *pt,BCIns *pc,uint32_t nres)

{
  BCIns ins;
  uint32_t nres_local;
  BCIns *pc_local;
  GCproto *pt_local;
  uint local_4;
  
  ins = pc[-1];
  if ((ins & 0xff) == 0x32) {
    ins = pc[(ulong)(ins >> 0x10) - 0x8000];
  }
  switch(ins & 0xff) {
  case 0x3f:
    local_4 = ((ins >> 8 & 0xff) + nres) - 1;
    break;
  default:
    local_4 = (uint)pt->framesize;
    break;
  case 0x41:
  case 0x43:
    local_4 = (ins >> 8 & 0xff) + (ins >> 0x10 & 0xff) + nres;
    break;
  case 0x49:
    local_4 = ((ins >> 8 & 0xff) + (ins >> 0x10) + nres) - 1;
  }
  return local_4;
}

Assistant:

static BCReg cur_topslot(GCproto *pt, const BCIns *pc, uint32_t nres)
{
  BCIns ins = pc[-1];
  if (bc_op(ins) == BC_UCLO)
    ins = pc[bc_j(ins)];
  switch (bc_op(ins)) {
  case BC_CALLM: case BC_CALLMT: return bc_a(ins) + bc_c(ins) + nres-1+1+LJ_FR2;
  case BC_RETM: return bc_a(ins) + bc_d(ins) + nres-1;
  case BC_TSETM: return bc_a(ins) + nres-1;
  default: return pt->framesize;
  }
}